

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uchar *puVar2;
  int *in_RCX;
  int *in_RDX;
  stbi__context *in_RSI;
  undefined4 in_R8D;
  float *hdr_data;
  stbi__result_info ri;
  uchar *data;
  stbi__result_info *in_stack_000003f0;
  int in_stack_000003fc;
  int *in_stack_00000400;
  int *in_stack_00000408;
  int *in_stack_00000410;
  stbi__context *in_stack_00000418;
  stbi__context *in_stack_ffffffffffffffa0;
  int req_comp_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int req_comp_01;
  undefined4 in_stack_ffffffffffffffd0;
  float *local_8;
  
  req_comp_01 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffffa0);
  req_comp_00 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (iVar1 == 0) {
    puVar2 = stbi__load_and_postprocess_8bit
                       (in_RSI,in_RDX,in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                        req_comp_01);
    if (puVar2 == (uchar *)0x0) {
      stbi__err("Image not of any known type, or corrupt");
      local_8 = (float *)0x0;
    }
    else {
      local_8 = stbi__ldr_to_hdr((stbi_uc *)in_stack_ffffffffffffffb8,
                                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                 (int)in_stack_ffffffffffffffb0,*in_RDX);
    }
  }
  else {
    local_8 = stbi__hdr_load(in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400
                             ,in_stack_000003fc,in_stack_000003f0);
    if (local_8 != (float *)0x0) {
      stbi__float_postprocess
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int *)local_8,
                 (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),req_comp_00);
    }
  }
  return local_8;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}